

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_hash.cpp
# Opt level: O2

void duckdb::TemplatedLoopCombineHash<false,duckdb::string_t>
               (Vector *input,Vector *hashes,SelectionVector *rsel,idx_t count)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  hash_t hVar7;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar8;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  idx_t i;
  ulong uVar9;
  string_t val;
  string_t val_00;
  string_t val_01;
  string_t val_02;
  string_t val_03;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_78;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (hashes->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (ulong *)hashes->data;
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      val_00.value.pointer.ptr = (char *)rsel;
      val_00.value._0_8_ = *(undefined8 *)(input->data + 8);
      uVar4 = Hash<duckdb::string_t>(*(duckdb **)input->data,val_00);
    }
    else {
      uVar4 = 0xbf58476d1ce4e5b9;
    }
    uVar8 = *puVar1;
    *puVar1 = (uVar8 >> 0x20 ^ uVar8) * -0x2917014799a6026d ^ uVar4;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (hashes->vector_type == CONSTANT_VECTOR) {
      uVar4 = *(ulong *)hashes->data;
      Vector::SetVectorType(hashes,FLAT_VECTOR);
      pdVar3 = hashes->data;
      uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar8 = extraout_RDX_00;
        for (uVar9 = 0; count != uVar9; uVar9 = uVar9 + 1) {
          uVar6 = uVar9;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)(local_78.sel)->sel_vector[uVar9];
          }
          val_03.value.pointer.ptr = (char *)uVar8;
          val_03.value._0_8_ = *(undefined8 *)(local_78.data + uVar6 * 0x10 + 8);
          hVar7 = Hash<duckdb::string_t>(*(duckdb **)(local_78.data + uVar6 * 0x10),val_03);
          *(hash_t *)(pdVar3 + uVar9 * 8) = hVar7 ^ uVar4;
          uVar8 = extraout_RDX_02;
        }
      }
      else {
        uVar8 = extraout_RDX_00;
        for (uVar9 = 0; count != uVar9; uVar9 = uVar9 + 1) {
          uVar6 = uVar9;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)(local_78.sel)->sel_vector[uVar9];
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
LAB_01339460:
            val.value.pointer.ptr = (char *)uVar8;
            val.value._0_8_ = *(undefined8 *)(local_78.data + uVar6 * 0x10 + 8);
            uVar5 = Hash<duckdb::string_t>(*(duckdb **)(local_78.data + uVar6 * 0x10),val);
            uVar8 = extraout_RDX_01;
          }
          else {
            uVar8 = uVar6 >> 6;
            uVar5 = 0xbf58476d1ce4e5b9;
            if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8]
                 >> (uVar6 & 0x3f) & 1) != 0) goto LAB_01339460;
          }
          *(ulong *)(pdVar3 + uVar9 * 8) = uVar5 ^ uVar4;
        }
      }
    }
    else {
      pdVar3 = hashes->data;
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        uVar4 = extraout_RDX;
        for (uVar8 = 0; count != uVar8; uVar8 = uVar8 + 1) {
          uVar9 = uVar8;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)(local_78.sel)->sel_vector[uVar8];
          }
          val_02.value.pointer.ptr = (char *)uVar4;
          val_02.value._0_8_ = *(undefined8 *)(local_78.data + uVar9 * 0x10 + 8);
          hVar7 = Hash<duckdb::string_t>(*(duckdb **)(local_78.data + uVar9 * 0x10),val_02);
          uVar4 = (*(ulong *)(pdVar3 + uVar8 * 8) >> 0x20 ^ *(ulong *)(pdVar3 + uVar8 * 8)) *
                  -0x2917014799a6026d ^ hVar7;
          *(ulong *)(pdVar3 + uVar8 * 8) = uVar4;
        }
      }
      else {
        uVar4 = extraout_RDX;
        for (uVar8 = 0; count != uVar8; uVar8 = uVar8 + 1) {
          uVar9 = uVar8;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            uVar9 = (ulong)(local_78.sel)->sel_vector[uVar8];
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
LAB_0133950b:
            val_01.value.pointer.ptr = (char *)uVar4;
            val_01.value._0_8_ = *(undefined8 *)(local_78.data + uVar9 * 0x10 + 8);
            uVar6 = Hash<duckdb::string_t>(*(duckdb **)(local_78.data + uVar9 * 0x10),val_01);
          }
          else {
            uVar4 = uVar9 >> 6;
            uVar6 = 0xbf58476d1ce4e5b9;
            if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4]
                 >> (uVar9 & 0x3f) & 1) != 0) goto LAB_0133950b;
          }
          uVar4 = (*(ulong *)(pdVar3 + uVar8 * 8) >> 0x20 ^ *(ulong *)(pdVar3 + uVar8 * 8)) *
                  -0x2917014799a6026d ^ uVar6;
          *(ulong *)(pdVar3 + uVar8 * 8) = uVar4;
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  return;
}

Assistant:

void TemplatedLoopCombineHash(Vector &input, Vector &hashes, const SelectionVector *rsel, idx_t count) {
	if (input.GetVectorType() == VectorType::CONSTANT_VECTOR && hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto ldata = ConstantVector::GetData<T>(input);
		auto hash_data = ConstantVector::GetData<hash_t>(hashes);

		auto other_hash = HashOp::Operation(*ldata, ConstantVector::IsNull(input));
		*hash_data = CombineHashScalar(*hash_data, other_hash);
	} else {
		UnifiedVectorFormat idata;
		input.ToUnifiedFormat(count, idata);
		if (hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			// mix constant with non-constant, first get the constant value
			auto constant_hash = *ConstantVector::GetData<hash_t>(hashes);
			// now re-initialize the hashes vector to an empty flat vector
			hashes.SetVectorType(VectorType::FLAT_VECTOR);
			TightLoopCombineHashConstant<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata), constant_hash,
			                                          FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                          idata.validity);
		} else {
			D_ASSERT(hashes.GetVectorType() == VectorType::FLAT_VECTOR);
			TightLoopCombineHash<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata),
			                                  FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                  idata.validity);
		}
	}
}